

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  char *pcVar1;
  allocator<char> local_169;
  string local_168;
  allocator<char> local_141;
  string local_140;
  allocator<char> local_119;
  string local_118;
  allocator<char> local_f1;
  string local_f0;
  int local_d0;
  allocator<char> local_c9;
  int ret;
  string stderr_file;
  undefined1 local_a0 [8];
  string stdout_file;
  undefined1 local_78 [8];
  string expected_file;
  allocator<char> local_41;
  undefined1 local_40 [8];
  string stdin_file_1;
  char *stdin_file;
  char **argv_local;
  int argc_local;
  
  std::ios_base::sync_with_stdio(false);
  std::ios::tie((ostream *)((long)&std::cin + *(long *)(std::cin + -0x18)));
  if (argc == 1) {
    argv_local._4_4_ = my_main(1,argv);
  }
  else if (argc == 2) {
    stdin_file_1.field_2._8_8_ = argv[1];
    freopen((char *)stdin_file_1.field_2._8_8_,"r",_stdin);
    argv_local._4_4_ = my_main(2,argv);
  }
  else if (argc == 5) {
    pcVar1 = argv[1];
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)local_40,pcVar1,&local_41);
    std::allocator<char>::~allocator(&local_41);
    pcVar1 = argv[2];
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_78,pcVar1,(allocator<char> *)(stdout_file.field_2._M_local_buf + 0xf)
              );
    std::allocator<char>::~allocator((allocator<char> *)(stdout_file.field_2._M_local_buf + 0xf));
    pcVar1 = argv[3];
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_a0,pcVar1,(allocator<char> *)(stderr_file.field_2._M_local_buf + 0xf)
              );
    std::allocator<char>::~allocator((allocator<char> *)(stderr_file.field_2._M_local_buf + 0xf));
    pcVar1 = argv[4];
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&ret,pcVar1,&local_c9);
    std::allocator<char>::~allocator(&local_c9);
    local_d0 = execute_main_with_dummy_stdio
                         ((string *)local_40,(string *)local_78,(string *)local_a0,(string *)&ret);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_f0,"input",&local_f1);
    output_with_header((string *)local_40,&local_f0);
    std::__cxx11::string::~string((string *)&local_f0);
    std::allocator<char>::~allocator(&local_f1);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_118,"output",&local_119);
    output_with_header((string *)local_a0,&local_118);
    std::__cxx11::string::~string((string *)&local_118);
    std::allocator<char>::~allocator(&local_119);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_140,"expected",&local_141);
    output_with_header((string *)local_78,&local_140);
    std::__cxx11::string::~string((string *)&local_140);
    std::allocator<char>::~allocator(&local_141);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_168,"stderr",&local_169);
    output_with_header((string *)&ret,&local_168);
    std::__cxx11::string::~string((string *)&local_168);
    std::allocator<char>::~allocator(&local_169);
    argv_local._4_4_ = local_d0;
    std::__cxx11::string::~string((string *)&ret);
    std::__cxx11::string::~string((string *)local_a0);
    std::__cxx11::string::~string((string *)local_78);
    std::__cxx11::string::~string((string *)local_40);
  }
  else {
    argv_local._4_4_ = 1;
  }
  return argv_local._4_4_;
}

Assistant:

int main(int argc, char** argv)
{
    std::ios::sync_with_stdio(false);
    std::cin.tie(nullptr);

#ifndef MAY_RUN_TEST_CASE
    return my_main(argc, argv);
#else
    if (argc == 1) {
        return my_main(argc, argv);
    } else if (argc == 2) {

        char* stdin_file = argv[1];
        freopen(stdin_file, "r", stdin);
        return my_main(argc, argv);

    } else if (argc == 5) {
        std::string stdin_file = argv[1];
        std::string expected_file = argv[2];
        std::string stdout_file = argv[3];
        std::string stderr_file = argv[4];

        const auto ret = execute_main_with_dummy_stdio(stdin_file, expected_file, stdout_file, stderr_file);
        output_with_header(stdin_file, "input");
        output_with_header(stdout_file, "output");
        output_with_header(expected_file, "expected");
        output_with_header(stderr_file, "stderr");
        return ret;

    }
    return 1;
#endif
}